

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::IGXMLScanner::scanEndTag(IGXMLScanner *this,bool *gotData)

{
  ElemStack *this_00;
  XMLBuffer *this_01;
  short sVar1;
  short sVar2;
  uint uVar3;
  ComplexTypeInfo *pCVar4;
  IdentityConstraintHandler *this_02;
  SchemaElementDecl *elem;
  XMLElementDecl *pXVar5;
  XMLDocumentHandler *pXVar6;
  ValueStackOf<bool> *this_03;
  Grammar *pGVar7;
  bool bVar8;
  bool bVar9;
  XMLCh XVar10;
  int iVar11;
  GrammarType GVar12;
  StackElem *pSVar13;
  XMLCh *pXVar14;
  XMLCh *pXVar15;
  ComplexTypeInfo **ppCVar16;
  DatatypeValidator *pDVar17;
  XMLCh *text2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar18;
  RuntimeException *this_04;
  XMLSize_t XVar19;
  XMLValidator *pXVar20;
  ReaderMgr *pRVar21;
  uint *puVar22;
  short *psVar23;
  Codes toEmit;
  XMLSize_t failure;
  ulong local_38;
  undefined4 extraout_var;
  
  *gotData = true;
  XVar19 = (this->super_XMLScanner).fElemStack.fStackTop;
  if (XVar19 == 0) {
    XMLScanner::emitError(&this->super_XMLScanner,MoreEndThanStartTags);
    do {
      XVar10 = ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
      if (XVar10 == L'>') break;
    } while (XVar10 != L'\0');
    this_04 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_04,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
               ,0x3ac,Scan_UnbalancedStartEnd,(this->super_XMLScanner).fMemoryManager);
    goto LAB_0029e79b;
  }
  if ((this->super_XMLScanner).fDoNamespaces == true) {
    puVar22 = &(this->super_XMLScanner).fElemStack.fStack[XVar19 - 1]->fCurrentURI;
  }
  else {
    puVar22 = &(this->super_XMLScanner).fEmptyNamespaceId;
  }
  this_00 = &(this->super_XMLScanner).fElemStack;
  uVar3 = *puVar22;
  if (this->fGrammarType == SchemaGrammarType) {
    pXVar14 = (this->super_XMLScanner).fElemStack.fStack[XVar19 - 1]->fSchemaElemName;
    pSVar13 = ElemStack::topElement(this_00);
  }
  else {
    pSVar13 = ElemStack::topElement(this_00);
    pXVar14 = QName::getRawName(pSVar13->fThisElement->fElementName);
  }
  pRVar21 = &(this->super_XMLScanner).fReaderMgr;
  bVar8 = XMLReader::skippedStringLong((this->super_XMLScanner).fReaderMgr.fCurReader,pXVar14);
  if (!bVar8) {
    XMLScanner::emitError
              (&this->super_XMLScanner,ExpectedEndOfTagX,pXVar14,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
    do {
      XVar10 = ReaderMgr::getNextChar(pRVar21);
      if (XVar10 == L'>') break;
    } while (XVar10 != L'\0');
    ElemStack::popTop(this_00);
    return;
  }
  if (pSVar13->fReaderNum != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
    XMLScanner::emitError(&this->super_XMLScanner,PartialTagMarkupError);
  }
  ReaderMgr::skipPastSpaces(pRVar21);
  bVar8 = ReaderMgr::skippedChar(pRVar21,L'>');
  if (!bVar8) {
    pXVar15 = QName::getRawName(pSVar13->fThisElement->fElementName);
    XMLScanner::emitError
              (&this->super_XMLScanner,UnterminatedEndTag,pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
  }
  if (this->fGrammarType == SchemaGrammarType) {
    bVar8 = ValueStackOf<bool>::pop(this->fErrorStack);
    (this->fPSVIElemContext).fErrorOccurred = bVar8;
    if (((this->super_XMLScanner).fValidate == true) &&
       (pSVar13->fThisElement->fCreateReason == Declared)) {
      pXVar20 = (this->super_XMLScanner).fValidator;
      if ((pXVar20[4].fReaderMgr)->fCurReader == (XMLReader *)0x0) {
        (this->fPSVIElemContext).fCurrentTypeInfo = (ComplexTypeInfo *)0x0;
LAB_0029e6c8:
        pDVar17 = (DatatypeValidator *)pXVar20[2]._vptr_XMLValidator;
      }
      else {
        ppCVar16 = ValueStackOf<xercesc_4_0::ComplexTypeInfo_*>::peek
                             ((ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)pXVar20[4].fReaderMgr)
        ;
        pCVar4 = *ppCVar16;
        (this->fPSVIElemContext).fCurrentTypeInfo = pCVar4;
        if (pCVar4 == (ComplexTypeInfo *)0x0) {
          pXVar20 = (this->super_XMLScanner).fValidator;
          goto LAB_0029e6c8;
        }
        pDVar17 = (DatatypeValidator *)0x0;
      }
      (this->fPSVIElemContext).fCurrentDV = pDVar17;
      if ((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0) {
        pXVar20 = (this->super_XMLScanner).fValidator;
        pRVar21 = pXVar20[3].fReaderMgr;
        *(undefined2 *)
         ((long)&(pRVar21->super_Locator)._vptr_Locator + (long)pXVar20[2].fErrorReporter * 2) = 0;
        (this->fPSVIElemContext).fNormalizedValue = (XMLCh *)pRVar21;
        if (pRVar21 == (ReaderMgr *)&XMLUni::fgZeroLenString) goto LAB_0029e23f;
        psVar23 = &XMLUni::fgZeroLenString;
        if (pRVar21 == (ReaderMgr *)0x0) {
LAB_0029e736:
          if (*psVar23 == 0) goto LAB_0029e23f;
        }
        else {
          do {
            sVar1 = *(short *)&(pRVar21->super_Locator)._vptr_Locator;
            if (sVar1 == 0) goto LAB_0029e736;
            pRVar21 = (ReaderMgr *)((long)&(pRVar21->super_Locator)._vptr_Locator + 2);
            sVar2 = *psVar23;
            psVar23 = psVar23 + 1;
          } while (sVar1 == sVar2);
        }
      }
    }
    else {
      (this->fPSVIElemContext).fCurrentDV = (DatatypeValidator *)0x0;
      (this->fPSVIElemContext).fCurrentTypeInfo = (ComplexTypeInfo *)0x0;
LAB_0029e23f:
      (this->fPSVIElemContext).fNormalizedValue = (XMLCh *)0x0;
    }
  }
  if ((this->super_XMLScanner).fValidate == true) {
    if (this->fGrammarType == DTDGrammarType) {
      if ((pSVar13->fCommentOrPISeen == true) && (*(int *)&pSVar13->fThisElement->field_0x2c == 0))
      {
        pXVar20 = (this->super_XMLScanner).fValidator;
        pXVar15 = QName::getRawName(pSVar13->fThisElement->fElementName);
        XMLValidator::emitError
                  (pXVar20,EmptyElemHasContent,pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        if (this->fGrammarType != DTDGrammarType) goto LAB_0029e2ec;
      }
      if ((pSVar13->fReferenceEscaped == true) && (*(int *)&pSVar13->fThisElement->field_0x2c == 3))
      {
        pXVar20 = (this->super_XMLScanner).fValidator;
        pXVar15 = QName::getRawName(pSVar13->fThisElement->fElementName);
        XMLValidator::emitError
                  (pXVar20,ElemChildrenHasInvalidWS,pXVar15,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
LAB_0029e2ec:
    pXVar20 = (this->super_XMLScanner).fValidator;
    iVar11 = (*pXVar20->_vptr_XMLValidator[2])(pXVar20,pSVar13->fThisElement,pSVar13->fChildren);
    if ((char)iVar11 == '\0') {
      if (pSVar13->fChildCount == 0) {
        pXVar20 = (this->super_XMLScanner).fValidator;
        iVar11 = (*(pSVar13->fThisElement->super_XSerializable)._vptr_XSerializable[0xd])();
        pXVar15 = (XMLCh *)CONCAT44(extraout_var_00,iVar11);
        toEmit = EmptyNotValidForContent;
LAB_0029e383:
        text2 = (XMLCh *)0x0;
      }
      else {
        pXVar20 = (this->super_XMLScanner).fValidator;
        if (pSVar13->fChildCount <= local_38) {
          iVar11 = (*(pSVar13->fThisElement->super_XSerializable)._vptr_XSerializable[0xd])();
          pXVar15 = (XMLCh *)CONCAT44(extraout_var_01,iVar11);
          toEmit = NotEnoughElemsForCM;
          goto LAB_0029e383;
        }
        pXVar15 = QName::getRawName(pSVar13->fChildren[local_38]);
        iVar11 = (*(pSVar13->fThisElement->super_XSerializable)._vptr_XSerializable[0xd])();
        text2 = (XMLCh *)CONCAT44(extraout_var,iVar11);
        toEmit = ElementNotValidForContent;
      }
      XMLValidator::emitError(pXVar20,toEmit,pXVar15,text2,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    if (this->fGrammarType != SchemaGrammarType) goto LAB_0029e3bc;
    if (*(char *)&(this->super_XMLScanner).fValidator[5]._vptr_XMLValidator == '\x01') {
      (this->fPSVIElemContext).fErrorOccurred = true;
LAB_0029e4a6:
      pDVar17 = (DatatypeValidator *)0x0;
    }
    else {
      pDVar17 = (this->fPSVIElemContext).fCurrentDV;
      if ((pDVar17 == (DatatypeValidator *)0x0) || (pDVar17->fType != Union)) goto LAB_0029e4a6;
      iVar11 = (*((this->super_XMLScanner).fValidationContext)->_vptr_ValidationContext[0xb])();
      pDVar17 = (DatatypeValidator *)CONCAT44(extraout_var_02,iVar11);
    }
    if (((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0) &&
       (bVar8 = *(bool *)((long)&(this->super_XMLScanner).fValidator[5]._vptr_XMLValidator + 1),
       (this->fPSVIElemContext).fIsSpecified = bVar8, bVar8 == true)) {
      (this->fPSVIElemContext).fNormalizedValue = *(XMLCh **)&pSVar13->fThisElement[1].fCreateReason
      ;
    }
    if (((this->super_XMLScanner).fValidate == true) &&
       (this_02 = this->fICHandler,
       (this_02 != (IdentityConstraintHandler *)0x0 &
       (this->super_XMLScanner).fIdentityConstraintChecking) == 1)) {
      elem = (SchemaElementDecl *)pSVar13->fThisElement;
      pXVar15 = (this->fContent).fBuffer;
      pXVar15[(this->fContent).fIndex] = L'\0';
      IdentityConstraintHandler::deactivateContext
                (this_02,elem,pXVar15,(this->super_XMLScanner).fValidationContext,
                 (this->fPSVIElemContext).fCurrentDV);
    }
  }
  else {
LAB_0029e3bc:
    pDVar17 = (DatatypeValidator *)0x0;
  }
  ElemStack::popTop(this_00);
  XVar19 = (this->super_XMLScanner).fElemStack.fStackTop;
  GVar12 = this->fGrammarType;
  if (GVar12 == SchemaGrammarType) {
    if ((this->super_XMLScanner).fPSVIHandler == (PSVIHandler *)0x0) {
      GVar12 = SchemaGrammarType;
    }
    else {
      endElementPSVI(this,(SchemaElementDecl *)pSVar13->fThisElement,pDVar17);
      GVar12 = this->fGrammarType;
    }
    (this->super_XMLScanner).fValidator[2].fErrorReporter = (XMLErrorReporter *)0x0;
  }
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    if (GVar12 == SchemaGrammarType) {
      iVar11 = pSVar13->fPrefixColonPos;
      this_01 = &(this->super_XMLScanner).fPrefixBuf;
      if ((long)iVar11 == 0xffffffffffffffff) {
        this_01->fIndex = 0;
      }
      else {
        this_01->fIndex = 0;
        XMLBuffer::append(this_01,pXVar14,(long)iVar11);
      }
    }
    else {
      pXVar14 = pSVar13->fThisElement->fElementName->fPrefix;
      (this->super_XMLScanner).fPrefixBuf.fIndex = 0;
      if ((pXVar14 != (XMLCh *)0x0) && (*pXVar14 != L'\0')) {
        XMLBuffer::append(&(this->super_XMLScanner).fPrefixBuf,pXVar14);
      }
    }
    pXVar5 = pSVar13->fThisElement;
    pXVar6 = (this->super_XMLScanner).fDocHandler;
    (this->super_XMLScanner).fPrefixBuf.fBuffer[(this->super_XMLScanner).fPrefixBuf.fIndex] = L'\0';
    (*pXVar6->_vptr_XMLDocumentHandler[6])(pXVar6,pXVar5,(ulong)uVar3,(ulong)(XVar19 == 0));
    GVar12 = this->fGrammarType;
  }
  if ((XVar19 == 0) || (GVar12 != SchemaGrammarType)) {
    *gotData = XVar19 != 0;
    if (XVar19 == 0) {
      return;
    }
  }
  else {
    this_03 = this->fErrorStack;
    if ((this_03->fVector).fCurCount == 0) {
LAB_0029e58d:
      bVar8 = (this->fPSVIElemContext).fErrorOccurred;
    }
    else {
      bVar9 = ValueStackOf<bool>::pop(this_03);
      bVar8 = true;
      if (!bVar9) goto LAB_0029e58d;
    }
    ValueVectorOf<bool>::ensureExtraCapacity(&this_03->fVector,1);
    XVar19 = (this_03->fVector).fCurCount;
    (this_03->fVector).fCurCount = XVar19 + 1;
    (this_03->fVector).fElemList[XVar19] = bVar8;
    *gotData = true;
  }
  XVar19 = (this->super_XMLScanner).fElemStack.fStackTop;
  if ((this->super_XMLScanner).fDoNamespaces != true) goto LAB_0029e6a0;
  pGVar7 = (this->super_XMLScanner).fElemStack.fStack[XVar19 - 1]->fCurrentGrammar;
  (this->super_XMLScanner).fGrammar = pGVar7;
  GVar12 = (*(pGVar7->super_XSerializable)._vptr_XSerializable[5])();
  this->fGrammarType = GVar12;
  if (GVar12 == SchemaGrammarType) {
    iVar11 = (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xd])();
    if ((char)iVar11 != '\0') {
      GVar12 = this->fGrammarType;
      goto LAB_0029e619;
    }
    lVar18 = 0x418;
    if ((this->super_XMLScanner).fValidatorFromUser == true) {
      this_04 = (RuntimeException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                (this_04,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                 ,0x4b6,Gen_NoSchemaValidator,(this->super_XMLScanner).fMemoryManager);
      goto LAB_0029e79b;
    }
LAB_0029e67a:
    (this->super_XMLScanner).fValidator =
         *(XMLValidator **)
          ((long)&(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler +
          lVar18);
  }
  else {
LAB_0029e619:
    if ((GVar12 == DTDGrammarType) &&
       (iVar11 = (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xc])(),
       (char)iVar11 == '\0')) {
      lVar18 = 0x410;
      if ((this->super_XMLScanner).fValidatorFromUser == true) {
        this_04 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (this_04,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                   ,0x4bd,Gen_NoDTDValidator,(this->super_XMLScanner).fMemoryManager);
LAB_0029e79b:
        __cxa_throw(this_04,&RuntimeException::typeinfo,XMLException::~XMLException);
      }
      goto LAB_0029e67a;
    }
  }
  pXVar20 = (this->super_XMLScanner).fValidator;
  (*pXVar20->_vptr_XMLValidator[0xb])(pXVar20,(this->super_XMLScanner).fGrammar);
  XVar19 = (this->super_XMLScanner).fElemStack.fStackTop;
LAB_0029e6a0:
  (this->super_XMLScanner).fValidate =
       (this->super_XMLScanner).fElemStack.fStack[XVar19 - 1]->fValidationFlag;
  return;
}

Assistant:

void IGXMLScanner::scanEndTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the end of the root element.
    gotData = true;

    //  Check if the element stack is empty. If so, then this is an unbalanced
    //  element (i.e. more ends than starts, perhaps because of bad text
    //  causing one to be skipped.)
    if (fElemStack.isEmpty())
    {
        emitError(XMLErrs::MoreEndThanStartTags);
        fReaderMgr.skipPastChar(chCloseAngle);
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_UnbalancedStartEnd, fMemoryManager);
    }

    //  Pop the stack of the element we are supposed to be ending. Remember
    //  that we don't own this. The stack just keeps them and reuses them.
    unsigned int uriId = (fDoNamespaces)
        ? fElemStack.getCurrentURI() : fEmptyNamespaceId;

    // these get initialized below
    const ElemStack::StackElem* topElem = 0;
    const XMLCh *elemName = 0;

    // Make sure that its the end of the element that we expect
    // special case for schema validation, whose element decls,
    // obviously don't contain prefix information
    if(fGrammarType == Grammar::SchemaGrammarType)
    {
        elemName = fElemStack.getCurrentSchemaElemName();
        topElem = fElemStack.topElement();
    }
    else
    {
        topElem = fElemStack.topElement();
        elemName = topElem->fThisElement->getFullName();
    }
    if (!fReaderMgr.skippedStringLong(elemName))
    {
        emitError
        (
            XMLErrs::ExpectedEndOfTagX
            , elemName
        );
        fReaderMgr.skipPastChar(chCloseAngle);
        fElemStack.popTop();
        return;
    }

    // Make sure we are back on the same reader as where we started
    if (topElem->fReaderNum != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialTagMarkupError);

    // Skip optional whitespace
    fReaderMgr.skipPastSpaces();

    // Make sure we find the closing bracket
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        emitError
        (
            XMLErrs::UnterminatedEndTag
            , topElem->fThisElement->getFullName()
        );
    }

    if (fGrammarType == Grammar::SchemaGrammarType)
    {
        // reset error occurred
        fPSVIElemContext.fErrorOccurred = fErrorStack->pop();
        if (fValidate && topElem->fThisElement->isDeclared())
        {
            fPSVIElemContext.fCurrentTypeInfo = ((SchemaValidator*) fValidator)->getCurrentTypeInfo();
            if(!fPSVIElemContext.fCurrentTypeInfo)
                fPSVIElemContext.fCurrentDV = ((SchemaValidator*) fValidator)->getCurrentDatatypeValidator();
            else
                fPSVIElemContext.fCurrentDV = 0;
            if(fPSVIHandler)
            {
                fPSVIElemContext.fNormalizedValue = ((SchemaValidator*) fValidator)->getNormalizedValue();

                if (XMLString::equals(fPSVIElemContext.fNormalizedValue, XMLUni::fgZeroLenString))
                    fPSVIElemContext.fNormalizedValue = 0;
            }
        }
        else
        {
            fPSVIElemContext.fCurrentDV = 0;
            fPSVIElemContext.fCurrentTypeInfo = 0;
            fPSVIElemContext.fNormalizedValue = 0;
        }
    }

    //  If validation is enabled, then lets pass him the list of children and
    //  this element and let him validate it.
    DatatypeValidator* psviMemberType = 0;
    if (fValidate)
    {

       //
       // XML1.0-3rd
       // Validity Constraint:
       // The declaration matches EMPTY and the element has no content (not even
       // entity references, comments, PIs or white space).
       //
       if ( (fGrammarType == Grammar::DTDGrammarType) &&
            (topElem->fCommentOrPISeen)               &&
            (((DTDElementDecl*) topElem->fThisElement)->getModelType() == DTDElementDecl::Empty))
       {
           fValidator->emitError
               (
               XMLValid::EmptyElemHasContent
               , topElem->fThisElement->getFullName()
               );
       }

       //
       // XML1.0-3rd
       // Validity Constraint:
       //
       // The declaration matches children and the sequence of child elements
       // belongs to the language generated by the regular expression in the
       // content model, with optional white space, comments and PIs
       // (i.e. markup matching production [27] Misc) between the start-tag and
       // the first child element, between child elements, or between the last
       // child element and the end-tag.
       //
       // Note that
       //    a CDATA section containing only white space or
       //    a reference to an entity whose replacement text is character references
       //       expanding to white space do not match the nonterminal S, and hence
       //       cannot appear in these positions; however,
       //    a reference to an internal entity with a literal value consisting
       //       of character references expanding to white space does match S,
       //       since its replacement text is the white space resulting from expansion
       //       of the character references.
       //
       if ( (fGrammarType == Grammar::DTDGrammarType)  &&
            (topElem->fReferenceEscaped)               &&
            (((DTDElementDecl*) topElem->fThisElement)->getModelType() == DTDElementDecl::Children))
       {
           fValidator->emitError
               (
               XMLValid::ElemChildrenHasInvalidWS
               , topElem->fThisElement->getFullName()
               );
       }
        XMLSize_t failure;
        bool res = fValidator->checkContent
        (
            topElem->fThisElement
            , topElem->fChildren
            , topElem->fChildCount
            , &failure
        );

        if (!res)
        {
            //  One of the elements is not valid for the content. NOTE that
            //  if no children were provided but the content model requires
            //  them, it comes back with a zero value. But we cannot use that
            //  to index the child array in this case, and have to put out a
            //  special message.
            if (!topElem->fChildCount)
            {
                fValidator->emitError
                (
                    XMLValid::EmptyNotValidForContent
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
            else if (failure >= topElem->fChildCount)
            {
                fValidator->emitError
                (
                    XMLValid::NotEnoughElemsForCM
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
            else
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , topElem->fChildren[failure]->getRawName()
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
        }


        if (fGrammarType == Grammar::SchemaGrammarType) {
            if (((SchemaValidator*) fValidator)->getErrorOccurred())
                fPSVIElemContext.fErrorOccurred = true;
            else if (fPSVIElemContext.fCurrentDV && fPSVIElemContext.fCurrentDV->getType() == DatatypeValidator::Union)
                psviMemberType = fValidationContext->getValidatingMemberType();

            if (fPSVIHandler)
            {
                fPSVIElemContext.fIsSpecified = ((SchemaValidator*) fValidator)->getIsElemSpecified();
                if(fPSVIElemContext.fIsSpecified)
                    fPSVIElemContext.fNormalizedValue = ((SchemaElementDecl *)topElem->fThisElement)->getDefaultValue();
            }

            // call matchers and de-activate context
            if (toCheckIdentityConstraint())
            {
                fICHandler->deactivateContext
                             (
                              (SchemaElementDecl *) topElem->fThisElement
                            , fContent.getRawBuffer()
                            , fValidationContext
                            , fPSVIElemContext.fCurrentDV
                             );
            }

        }
    }

    // QName dv needed topElem to resolve URIs on the checkContent
    fElemStack.popTop();

    // See if it was the root element, to avoid multiple calls below
    const bool isRoot = fElemStack.isEmpty();

    if (fGrammarType == Grammar::SchemaGrammarType)
    {
        if (fPSVIHandler)
        {
            endElementPSVI(
                (SchemaElementDecl*)topElem->fThisElement, psviMemberType);
        }
        // now we can reset the datatype buffer, since the
        // application has had a chance to copy the characters somewhere else
        ((SchemaValidator *)fValidator)->clearDatatypeBuffer();
    }

    // If we have a doc handler, tell it about the end tag
    if (fDocHandler)
    {
        if (fGrammarType == Grammar::SchemaGrammarType) {
            if (topElem->fPrefixColonPos != -1)
                fPrefixBuf.set(elemName, topElem->fPrefixColonPos);
            else
                fPrefixBuf.reset();
        }
        else {
            fPrefixBuf.set(topElem->fThisElement->getElementName()->getPrefix());
        }
        fDocHandler->endElement
        (
            *topElem->fThisElement
            , uriId
            , isRoot
            , fPrefixBuf.getRawBuffer()
        );
    }

    if (fGrammarType == Grammar::SchemaGrammarType) {
        if (!isRoot)
        {
            // update error information
            fErrorStack->push((fErrorStack->size() && fErrorStack->pop()) || fPSVIElemContext.fErrorOccurred);


        }
    }

    // If this was the root, then done with content
    gotData = !isRoot;

    if (gotData) {
        if (fDoNamespaces) {
            // Restore the grammar
            fGrammar = fElemStack.getCurrentGrammar();
            fGrammarType = fGrammar->getGrammarType();
            if (fGrammarType == Grammar::SchemaGrammarType && !fValidator->handlesSchema()) {
                if (fValidatorFromUser)
                    ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Gen_NoSchemaValidator, fMemoryManager);
                else {
                    fValidator = fSchemaValidator;
                }
            }
            else if (fGrammarType == Grammar::DTDGrammarType && !fValidator->handlesDTD()) {
                if (fValidatorFromUser)
                    ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Gen_NoDTDValidator, fMemoryManager);
                else {
                    fValidator = fDTDValidator;
                }
            }

            fValidator->setGrammar(fGrammar);
        }

        // Restore the validation flag
        fValidate = fElemStack.getValidationFlag();
    }
}